

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexParsing.h
# Opt level: O0

string * __thiscall
jaegertracing::utils::HexParsing::readSegment_abi_cxx11_
          (string *__return_storage_ptr__,HexParsing *this,istream *in,size_t maxChars,char delim)

{
  bool bVar1;
  long *plVar2;
  bool local_81;
  allocator local_65 [13];
  istream *local_58;
  size_t i;
  string local_48 [7];
  char ch;
  string buffer;
  char delim_local;
  size_t maxChars_local;
  istream *in_local;
  
  buffer.field_2._M_local_buf[0xf] = (char)maxChars;
  std::__cxx11::string::string(local_48);
  i._7_1_ = '\0';
  local_58 = (istream *)0x0;
  while( true ) {
    local_81 = false;
    if (local_58 < in) {
      plVar2 = (long *)std::istream::get((char *)this);
      local_81 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)))
      ;
    }
    if (local_81 == false) goto LAB_0035eedc;
    bVar1 = isHex(i._7_1_);
    if (!bVar1) break;
    std::__cxx11::string::push_back((char)local_48);
    local_58 = local_58 + 1;
  }
  if (i._7_1_ == buffer.field_2._M_local_buf[0xf]) {
    std::istream::putback((char)this);
LAB_0035eedc:
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_48);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_65);
    std::allocator<char>::~allocator((allocator<char> *)local_65);
  }
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

inline std::string readSegment(std::istream& in, size_t maxChars, char delim)
{
    std::string buffer;
    auto ch = '\0';
    for (auto i = static_cast<size_t>(0); i < maxChars && in.get(ch); ++i) {
        if (!isHex(ch)) {
            if (ch == delim) {
                in.putback(ch);
                break;
            }
            else {
                return "";
            }
        }

        buffer.push_back(ch);
    }
    return buffer;
}